

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressor.cpp
# Opt level: O1

bool __thiscall
Imf_2_5::DwaCompressor::Classifier::match(Classifier *this,string *suffix,PixelType type)

{
  pointer pcVar1;
  size_t sVar2;
  long *plVar3;
  int iVar4;
  size_t sVar5;
  bool bVar6;
  string tmp;
  long *local_48;
  size_t local_40;
  long local_38 [2];
  
  if (this->_type == type) {
    if (this->_caseInsensitive == true) {
      pcVar1 = (suffix->_M_dataplus)._M_p;
      local_48 = local_38;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_48,pcVar1,pcVar1 + suffix->_M_string_length);
      sVar2 = local_40;
      plVar3 = local_48;
      if (local_40 != 0) {
        sVar5 = 0;
        do {
          iVar4 = tolower((int)*(char *)((long)plVar3 + sVar5));
          *(char *)((long)plVar3 + sVar5) = (char)iVar4;
          sVar5 = sVar5 + 1;
        } while (sVar2 != sVar5);
      }
      if (local_40 == (this->_suffix)._M_string_length) {
        if (local_40 == 0) {
          bVar6 = true;
        }
        else {
          iVar4 = bcmp(local_48,(this->_suffix)._M_dataplus._M_p,local_40);
          bVar6 = iVar4 == 0;
        }
      }
      else {
        bVar6 = false;
      }
      if (local_48 == local_38) {
        return bVar6;
      }
      operator_delete(local_48,local_38[0] + 1);
      return bVar6;
    }
    sVar2 = suffix->_M_string_length;
    if (sVar2 == (this->_suffix)._M_string_length) {
      if (sVar2 != 0) {
        iVar4 = bcmp((suffix->_M_dataplus)._M_p,(this->_suffix)._M_dataplus._M_p,sVar2);
        return iVar4 == 0;
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool match (const std::string &suffix, const PixelType type) const
    {
        if (_type != type) return false;

        if (_caseInsensitive) 
        {
            std::string tmp(suffix);
            std::transform(tmp.begin(), tmp.end(), tmp.begin(), tolower);
            return tmp == _suffix;
        }

        return suffix == _suffix;
    }